

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_> *node)

{
  bool bVar1;
  pointer pVVar2;
  pointer this_00;
  unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_> *in_RDX;
  pointer local_128;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_d0;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_c8;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_c0;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_b8;
  pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
  local_b0;
  reference local_a0;
  pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
  *dim;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  *__range2;
  vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  new_outer_dims;
  NDVector *ptr;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_58;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_50;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_48 [3];
  unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_> local_30;
  unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_> local_28 [2];
  unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_> *node_local;
  Transformer *this_local;
  
  node_local = node;
  this_local = this;
  pVVar2 = std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>::unique_ptr
            (&local_30,&pVVar2->id);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>.
              _M_t.
              super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
              .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->msb)._M_t.
            super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
  )(local_28,node,&local_30);
  pVVar2 = std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>::operator=
            (&pVVar2->id,local_28);
  std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>::~unique_ptr
            (local_28);
  std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>::~unique_ptr
            (&local_30);
  pVVar2 = std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_50,&pVVar2->msb);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>.
              _M_t.
              super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
              .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node).
            _vptr_Node)(local_48,node,&local_50);
  pVVar2 = std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            (&pVVar2->msb,local_48);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_48);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_50);
  pVVar2 = std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            ((unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *)
             &ptr,&pVVar2->lsb);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>.
              _M_t.
              super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
              .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node).
            _vptr_Node)
            (&local_58,node,
             (unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *)
             &ptr);
  pVVar2 = std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>::operator->
                     (in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            (&pVVar2->lsb,&local_58);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_58);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            ((unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *)
             &ptr);
  pVVar2 = std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>::get
                     (in_RDX);
  if (pVVar2 == (pointer)0x0) {
    local_128 = (pointer)0x0;
  }
  else {
    local_128 = (pointer)__dynamic_cast(pVVar2,&Vector::typeinfo,&NDVector::typeinfo,0);
  }
  new_outer_dims.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_128;
  if (local_128 != (pointer)0x0) {
    std::
    vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
    ::vector((vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
              *)&__range2);
    this_00 = new_outer_dims.
              super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage + 2;
    __end2 = std::
             vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
             ::begin((vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                      *)this_00);
    dim = (pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
           *)std::
             vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
             ::end((vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                    *)this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
                                  *)&dim);
      if (!bVar1) break;
      local_a0 = __gnu_cxx::
                 __normal_iterator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
                 ::operator*(&__end2);
      std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
      unique_ptr(&local_c0,&local_a0->first);
      (*(code *)(((node->_M_t).
                  super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
                  .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node).
                _vptr_Node)(&local_b8,node,&local_c0);
      std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
      unique_ptr(&local_d0,&local_a0->second);
      (*(code *)(((node->_M_t).
                  super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
                  .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node).
                _vptr_Node)(&local_c8,node,&local_d0);
      std::
      pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
      ::
      pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_true>
                (&local_b0,&local_b8,&local_c8);
      std::
      vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ::push_back((vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                   *)&__range2,&local_b0);
      std::
      pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
      ::~pair(&local_b0);
      std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
      ~unique_ptr(&local_c8);
      std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
      ~unique_ptr(&local_d0);
      std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
      ~unique_ptr(&local_b8);
      std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
      ~unique_ptr(&local_c0);
      __gnu_cxx::
      __normal_iterator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_*,_std::vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
    ::operator=((vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                 *)(new_outer_dims.
                    super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),
                (vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                 *)&__range2);
    std::
    vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
    ::~vector((vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
               *)&__range2);
  }
  std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>::unique_ptr
            ((unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_> *)this,in_RDX
            );
  return (__uniq_ptr_data<verilogAST::Vector,_std::default_delete<verilogAST::Vector>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Vector,_std::default_delete<verilogAST::Vector>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Vector> Transformer::visit(std::unique_ptr<Vector> node) {
  node->id = this->visit(std::move(node->id));
  node->msb = this->visit(std::move(node->msb));
  node->lsb = this->visit(std::move(node->lsb));
  if (auto ptr = dynamic_cast<NDVector*>(node.get())) {
    std::vector<
        std::pair<std::unique_ptr<Expression>, std::unique_ptr<Expression>>>
        new_outer_dims;
    for (auto& dim : ptr->outer_dims) {
      new_outer_dims.push_back({this->visit(std::move(dim.first)),
                                this->visit(std::move(dim.second))});
    }
    ptr->outer_dims = std::move(new_outer_dims);
  }
  return node;
}